

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfutureinterface.cpp
# Opt level: O3

void __thiscall QFutureInterfaceBase::waitForResume(QFutureInterfaceBase *this)

{
  __pointer_type copy;
  uint uVar1;
  QFutureInterfaceBasePrivate *this_00;
  QThreadPool *this_01;
  bool bVar2;
  
  this_00 = this->d;
  uVar1 = (this_00->state).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
          super___atomic_base<int>._M_i;
  if ((char)((uVar1 & 8) >> 3) != '\0' || (uVar1 & 0x30) == 0) {
    return;
  }
  if ((((QBasicAtomicPointer<QMutexPrivate> *)&this_00->m_mutex)->_q_value)._M_b._M_p ==
      (__pointer_type)0x0) {
    LOCK();
    bVar2 = (((QBasicAtomicPointer<QMutexPrivate> *)&this_00->m_mutex)->_q_value)._M_b._M_p ==
            (__pointer_type)0x0;
    if (bVar2) {
      (((QBasicAtomicPointer<QMutexPrivate> *)&this_00->m_mutex)->_q_value)._M_b._M_p =
           (__pointer_type)0x1;
    }
    UNLOCK();
    if (bVar2) goto LAB_003cd527;
  }
  QBasicMutex::lockInternal((QBasicMutex *)this_00);
LAB_003cd527:
  uVar1 = (this->d->state).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
          super___atomic_base<int>._M_i;
  if ((char)((uVar1 & 8) >> 3) == '\0' && (uVar1 & 0x30) != 0) {
    this_01 = this->d->m_pool;
    if ((this_01 == (QThreadPool *)0x0) &&
       (this_01 = QThreadPool::globalInstance(), this_01 == (QThreadPool *)0x0)) {
      this_01 = (QThreadPool *)0x0;
    }
    else {
      QThreadPool::releaseThread(this_01);
    }
    QWaitCondition::wait(&this->d->pausedWaitCondition,this->d);
    anon_unknown.dwarf_11dd415::ThreadPoolThreadReleaser::~ThreadPoolThreadReleaser
              ((ThreadPoolThreadReleaser *)this_01);
  }
  LOCK();
  copy = (((QBasicAtomicPointer<QMutexPrivate> *)&this_00->m_mutex)->_q_value)._M_b._M_p;
  (((QBasicAtomicPointer<QMutexPrivate> *)&this_00->m_mutex)->_q_value)._M_b._M_p =
       (__pointer_type)0x0;
  UNLOCK();
  if (copy == (__pointer_type)0x1) {
    return;
  }
  QBasicMutex::unlockInternalFutex((QBasicMutex *)this_00,copy);
  return;
}

Assistant:

void QFutureInterfaceBase::waitForResume()
{
    // return early if possible to avoid taking the mutex lock.
    {
        const int state = d->state.loadRelaxed();
        if (!(state & suspendingOrSuspended) || (state & Canceled))
            return;
    }

    QMutexLocker lock(&d->m_mutex);
    const int state = d->state.loadRelaxed();
    if (!(state & suspendingOrSuspended) || (state & Canceled))
        return;

    // decrease active thread count since this thread will wait.
    const ThreadPoolThreadReleaser releaser(d->pool());

    d->pausedWaitCondition.wait(&d->m_mutex);
}